

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcolumnview.cpp
# Opt level: O0

void QColumnView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 uVar1;
  bool bVar2;
  QtMocHelpers *in_RCX;
  int in_EDX;
  int in_ESI;
  void *_v_1;
  void *_v;
  QColumnView *in_stack_00000018;
  QColumnView *_t;
  QModelIndex *in_stack_ffffffffffffffb8;
  QColumnView *in_stack_ffffffffffffffc0;
  
  if ((in_ESI == 0) && (in_EDX == 0)) {
    updatePreviewWidget(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  if ((in_ESI != 5) ||
     (bVar2 = QtMocHelpers::indexOfMethod<void(QColumnView::*)(QModelIndex_const&)>
                        (in_RCX,(void **)updatePreviewWidget,0,0), !bVar2)) {
    if ((in_ESI == 1) && (uVar1 = *(undefined8 *)in_RCX, in_EDX == 0)) {
      bVar2 = resizeGripsVisible(in_stack_ffffffffffffffc0);
      *(bool *)uVar1 = bVar2;
    }
    if ((in_ESI == 2) && (in_EDX == 0)) {
      setResizeGripsVisible(in_stack_00000018,_v._7_1_);
    }
  }
  return;
}

Assistant:

void QColumnView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QColumnView *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->updatePreviewWidget((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QColumnView::*)(const QModelIndex & )>(_a, &QColumnView::updatePreviewWidget, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->resizeGripsVisible(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setResizeGripsVisible(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}